

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckExtraSpaces.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckExtraSpaces(Parser *this,unsigned_long max,bool checkEmptyLines)

{
  string *psVar1;
  string *psVar2;
  char cVar3;
  char *pcVar4;
  pointer pcVar5;
  char *__s;
  size_t pos;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  Error error;
  char localval [21];
  value_type local_80;
  char local_48 [24];
  
  this->m_TestsDone[0xb] = true;
  __s = (char *)operator_new__(0xff);
  snprintf(__s,0xff,"Spaces at the end of line = %ld max spaces",max);
  pcVar4 = (char *)this->m_TestsDescription[0xb]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0xb),0,pcVar4,(ulong)__s);
  operator_delete__(__s);
  psVar1 = &this->m_Buffer;
  pos = std::__cxx11::string::find((char *)psVar1,0x169501,0);
  if (pos == 0xffffffffffffffff) {
    bVar10 = true;
  }
  else {
    bVar9 = 0;
    do {
      pcVar5 = (psVar1->_M_dataplus)._M_p;
      sVar6 = pos;
      if (checkEmptyLines) {
LAB_001557ba:
        sVar6 = pos;
        uVar8 = 0xffffffffffffffff;
        do {
          uVar7 = uVar8;
          if (((long)sVar6 < 1) || (pcVar5[sVar6 - 1] != ' ')) goto LAB_001558db;
          uVar8 = uVar7 + 1;
          sVar6 = sVar6 - 1;
        } while (uVar8 < max);
        local_80.description._M_dataplus._M_p = (pointer)&local_80.description.field_2;
        local_80.description._M_string_length = 0;
        local_80.description.field_2._M_local_buf[0] = '\0';
        local_80.line = GetLineNumber(this,pos,false);
        psVar2 = &local_80.description;
        local_80.number = 0xb;
        local_80.line2 = local_80.line;
        std::__cxx11::string::_M_replace
                  ((ulong)psVar2,0,(char *)local_80.description._M_string_length,0x176b8e);
        snprintf(local_48,0x15,"%ld",uVar7 + 2);
        std::__cxx11::string::append((char *)psVar2);
        std::__cxx11::string::append((char *)psVar2);
        snprintf(local_48,0x15,"%ld",max);
        std::__cxx11::string::append((char *)psVar2);
        std::__cxx11::string::append((char *)psVar2);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.description._M_dataplus._M_p != &local_80.description.field_2) {
          operator_delete(local_80.description._M_dataplus._M_p);
        }
        bVar9 = 1;
      }
      else {
        do {
          if ((long)sVar6 < 2) goto LAB_001558db;
          cVar3 = pcVar5[sVar6 - 1];
          sVar6 = sVar6 - 1;
        } while (cVar3 == ' ');
        if (cVar3 != '\n') goto LAB_001557ba;
      }
LAB_001558db:
      pos = std::__cxx11::string::find((char *)psVar1,0x169501,pos + 1);
    } while (pos != 0xffffffffffffffff);
    bVar10 = (bool)(bVar9 ^ 1);
  }
  return bVar10;
}

Assistant:

bool Parser::CheckExtraSpaces(unsigned long max,bool checkEmptyLines)
{
  m_TestsDone[SPACES] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Spaces at the end of line = %ld max spaces",max);
  m_TestsDescription[SPACES] = val;
  delete [] val;

  bool hasError = false;
  auto posEndOfLine = static_cast<long int>(m_Buffer.find("\r\n", 0));
  while(posEndOfLine != -1)
    {
    bool checking = true;
    if(!checkEmptyLines)
      {
      // Check if the line is empty
      long pos = posEndOfLine-1;
      bool empty = true;
      while(pos>0 && m_Buffer[pos]!='\n')
        {
        if(m_Buffer[pos] != ' ')
          {
          empty = false;
          break;
          }
        pos--;
        }

      if(empty)
        {
        checking = false;
        }
      }

     if(checking)
     {
      // We try to find the word before that
      long i=posEndOfLine-1;
      unsigned long space = 0;
      while(i>=0)
        {
        if(m_Buffer[i] == ' ')
          {
          space++;
          if(space > max)
            {
            Error error;
            error.line = this->GetLineNumber(posEndOfLine);
            error.line2 = error.line;
            error.number = SPACES;
            error.description = "Number of spaces before end of line exceed: ";
            constexpr size_t length = 21;
            char localval[length];
            snprintf(localval,length,"%ld",space);
            error.description += localval;
            error.description += " (max=";
            snprintf(localval,length,"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            break; // avoid multiple error line
            }
          }
        else
          {
          break;
          }
        i--;
        }
      }
    posEndOfLine = static_cast<long int>(m_Buffer.find("\r\n",posEndOfLine+1));
    }

  return !hasError;
}